

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_light.cpp
# Opt level: O0

Vector2D __thiscall
CGL::SceneObjects::EnvironmentLight::xy_to_theta_phi(EnvironmentLight *this,Vector2D *xy)

{
  double *in_RDX;
  long in_RSI;
  Vector2D *in_RDI;
  double dVar1;
  double x_00;
  Vector2D VVar2;
  double theta;
  double phi;
  double y;
  double x;
  uint32_t h;
  uint32_t w;
  
  dVar1 = *in_RDX / (double)**(uint **)(in_RSI + 8);
  dVar1 = (dVar1 + dVar1) * 3.141592653589793;
  x_00 = (in_RDX[1] / (double)*(uint *)(*(long *)(in_RSI + 8) + 8)) * 3.141592653589793;
  Vector2D::Vector2D(in_RDI,x_00,dVar1);
  VVar2.y = dVar1;
  VVar2.x = x_00;
  return VVar2;
}

Assistant:

Vector2D EnvironmentLight::xy_to_theta_phi(const Vector2D& xy) const {
    uint32_t w = envMap->w, h = envMap->h;
    double x = xy.x;
    double y = xy.y;
    double phi = x / w * 2.0 * PI;
    double theta = y / h * PI;
    return Vector2D(theta, phi);
  }